

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall google::protobuf::internal::DynamicMapField::~DynamicMapField(DynamicMapField *this)

{
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>_3
  *this_00;
  string *psVar1;
  iterator __begin2;
  UntypedMapIterator local_38;
  void *local_20;
  
  local_38.node_ = (NodeBase *)MapFieldBase::arena((MapFieldBase *)this);
  local_20 = (void *)0x0;
  psVar1 = absl::lts_20240722::log_internal::
           Check_EQImpl<google::protobuf::Arena*,decltype(nullptr)>
                     ((Arena **)&local_38,&local_20,"arena() == nullptr");
  if (psVar1 == (string *)0x0) {
    this_00 = &(this->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).field_0;
    UntypedMapBase::begin(&local_38,(UntypedMapBase *)&this_00->map_);
    while ((Arena *)local_38.node_ != (Arena *)0x0) {
      MapValueRef::DeleteData
                ((MapValueRef *)&((ThreadSafeArena *)&(local_38.node_)->next)->first_arena_);
      UntypedMapIterator::PlusPlus(&local_38);
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(&this_00->map_);
    TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
    ~TypeDefinedMapFieldBase
              (&this->
                super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              );
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/map_field.cc"
             ,0x1af,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

DynamicMapField::~DynamicMapField() {
  ABSL_DCHECK_EQ(arena(), nullptr);
  // DynamicMapField owns map values. Need to delete them before clearing the
  // map.
  for (auto& kv : map_) {
    kv.second.DeleteData();
  }
  map_.clear();
}